

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall capnp::_::BuilderArena::~BuilderArena(BuilderArena *this)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar3;
  ArrayDisposer *pAVar4;
  
  if ((this->moreSegments).ptr.ptr != (MultiSegmentState *)0x0) {
    (this->moreSegments).ptr.ptr = (MultiSegmentState *)0x0;
    (**((this->moreSegments).ptr.disposer)->_vptr_Disposer)();
  }
  pMVar1 = (this->localCapTable).capTable.builder.ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    pRVar2 = (this->localCapTable).capTable.builder.pos;
    pMVar3 = (this->localCapTable).capTable.builder.endPtr;
    (this->localCapTable).capTable.builder.ptr =
         (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    (this->localCapTable).capTable.builder.pos =
         (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    (this->localCapTable).capTable.builder.endPtr =
         (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pAVar4 = (this->localCapTable).capTable.builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pMVar1,0x10,(long)pRVar2 - (long)pMVar1 >> 4,(long)pMVar3 - (long)pMVar1 >> 4,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
               ::destruct);
    return;
  }
  return;
}

Assistant:

BuilderArena::~BuilderArena() noexcept(false) {}